

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O1

string * __thiscall
libtorrent::add_torrent_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,add_torrent_alert *this)

{
  sha256_hash *this_00;
  element_type *peVar1;
  error_category *peVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  size_t sVar5;
  char *in_RCX;
  char *pcVar6;
  span<const_char> in;
  char info_hash [41];
  char msg [600];
  long *local_2c8 [2];
  long local_2b8 [2];
  char local_2a8 [48];
  uint local_278;
  uint uStack_274;
  uint uStack_270;
  uint uStack_26c;
  uint local_268;
  
  peVar1 = (this->params).ti.
           super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    if ((this->params).name._M_string_length == 0) {
      this_00 = &(this->params).info_hashes.v2;
      bVar3 = digest32<256L>::is_all_zeros(this_00);
      if (bVar3) {
        local_268 = (this->params).info_hashes.v1.m_number._M_elems[4];
        local_278 = (this->params).info_hashes.v1.m_number._M_elems[0];
        uStack_274 = (this->params).info_hashes.v1.m_number._M_elems[1];
        uStack_270 = (this->params).info_hashes.v1.m_number._M_elems[2];
        uStack_26c = (this->params).info_hashes.v1.m_number._M_elems[3];
      }
      else {
        local_268 = (this->params).info_hashes.v2.m_number._M_elems[4];
        local_278 = (this_00->m_number)._M_elems[0];
        uStack_274 = (this->params).info_hashes.v2.m_number._M_elems[1];
        uStack_270 = (this->params).info_hashes.v2.m_number._M_elems[2];
        uStack_26c = (this->params).info_hashes.v2.m_number._M_elems[3];
      }
      pcVar6 = local_2a8;
      in.m_len = (difference_type)pcVar6;
      in.m_ptr = (char *)0x14;
      aux::to_hex((aux *)&local_278,in,in_RCX);
    }
    else {
      pcVar6 = (this->params).name._M_dataplus._M_p;
    }
  }
  else {
    pcVar6 = (peVar1->m_files).m_name._M_dataplus._M_p;
  }
  if ((this->error).failed_ == true) {
    iVar4 = (**((this->error).cat_)->_vptr_error_category)();
    peVar2 = (this->error).cat_;
    (*peVar2->_vptr_error_category[4])(local_2c8,peVar2,(ulong)(uint)(this->error).val_);
    snprintf((char *)&local_278,600,"failed to add torrent \"%s\": [%s] %s",pcVar6,
             CONCAT44(extraout_var,iVar4),local_2c8[0]);
    if (local_2c8[0] != local_2b8) {
      operator_delete(local_2c8[0],local_2b8[0] + 1);
    }
  }
  else {
    snprintf((char *)&local_278,600,"added torrent: %s",pcVar6);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar5 = strlen((char *)&local_278);
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,&local_278,(long)&local_278 + sVar5);
  return __return_storage_ptr__;
}

Assistant:

std::string add_torrent_alert::message() const
	{
#ifdef TORRENT_DISABLE_ALERT_MSG
		return {};
#else
		char msg[600];
		char info_hash[41];
		char const* torrent_name = info_hash;
		if (params.ti) torrent_name = params.ti->name().c_str();
		else if (!params.name.empty()) torrent_name = params.name.c_str();
#if TORRENT_ABI_VERSION == 1
		else if (!params.url.empty()) torrent_name = params.url.c_str();
#endif
		else aux::to_hex(params.info_hashes.get_best(), info_hash);

		if (error)
		{
			std::snprintf(msg, sizeof(msg), "failed to add torrent \"%s\": [%s] %s"
				, torrent_name, error.category().name()
				, error.message().c_str());
		}
		else
		{
			std::snprintf(msg, sizeof(msg), "added torrent: %s", torrent_name);
		}
		return msg;
#endif
	}